

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadInt32(ON_BinaryArchive *this,size_t count,ON__INT32 *p)

{
  undefined1 uVar1;
  ON__INT32 OVar2;
  bool bVar3;
  ON__INT32 *pOStack_30;
  uchar c;
  uchar *b;
  bool rc;
  ON__INT32 *p_local;
  size_t count_local;
  ON_BinaryArchive *this_local;
  
  bVar3 = ReadByte(this,count << 2,p);
  if ((bVar3) && (pOStack_30 = p, p_local = (ON__INT32 *)count, this->m_endian == big_endian)) {
    while (p_local != (ON__INT32 *)0x0) {
      OVar2 = *pOStack_30;
      *(undefined1 *)pOStack_30 = *(undefined1 *)((long)pOStack_30 + 3);
      *(char *)((long)pOStack_30 + 3) = (char)OVar2;
      uVar1 = *(undefined1 *)((long)pOStack_30 + 1);
      *(undefined1 *)((long)pOStack_30 + 1) = *(undefined1 *)((long)pOStack_30 + 2);
      *(undefined1 *)((long)pOStack_30 + 2) = uVar1;
      pOStack_30 = pOStack_30 + 1;
      p_local = (ON__INT32 *)((long)p_local + -1);
    }
  }
  return bVar3;
}

Assistant:

bool
ON_BinaryArchive::ReadInt32( // Read an array of 32 bit signed integers
		size_t count,            // number of 32 bit signed integers to read
		ON__INT32* p
		)
{
  bool rc = ReadByte( count<<2, p );
  if (rc && m_endian == ON::endian::big_endian)
  {
		unsigned char* b= (unsigned char*)p;
		unsigned char  c;
		while(count--) {
			c = b[0]; b[0] = b[3]; b[3] = c;
			c = b[1]; b[1] = b[2]; b[2] = c;
			b += 4;
		}
  }
  return rc;
}